

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

double __thiscall soplex::SoPlexBase<double>::objValueReal(SoPlexBase<double> *this)

{
  bool bVar1;
  Status SVar2;
  int iVar3;
  SoPlexBase<double> *in_RDI;
  Real RVar4;
  SoPlexBase<double> *in_stack_ffffffffffffffe0;
  double local_8;
  
  SVar2 = status(in_RDI);
  if (SVar2 == UNBOUNDED) {
    RVar4 = realParam(in_RDI,INFTY);
    iVar3 = intParam(in_RDI,OBJSENSE);
    local_8 = RVar4 * (double)iVar3;
  }
  else {
    SVar2 = status(in_RDI);
    if (SVar2 == INFEASIBLE) {
      RVar4 = realParam(in_RDI,INFTY);
      iVar3 = intParam(in_RDI,OBJSENSE);
      local_8 = -RVar4 * (double)iVar3;
    }
    else {
      bVar1 = hasSol(in_RDI);
      if (bVar1) {
        _syncRealSolution(in_stack_ffffffffffffffe0);
        local_8 = (in_RDI->_solReal)._objVal;
      }
      else {
        local_8 = 0.0;
      }
    }
  }
  return local_8;
}

Assistant:

R SoPlexBase<R>::objValueReal()
{
   assert(OBJSENSE_MAXIMIZE == 1);
   assert(OBJSENSE_MINIMIZE == -1);

   if(status() == SPxSolverBase<R>::UNBOUNDED)
      return realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(status() == SPxSolverBase<R>::INFEASIBLE)
      return -realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(hasSol())
   {
      _syncRealSolution();
      return _solReal._objVal;
   }
   else
      return 0.0;
}